

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPlot.cpp
# Opt level: O2

bool __thiscall
SVGChart::LogTickIterator::GetNextTick
          (LogTickIterator *this,float *outTick,bool *outIsMajorTick,string *outFormatString)

{
  AxisSetup *pAVar1;
  bool bVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  char theBuf [128];
  char local_98 [128];
  
  pAVar1 = (this->super_TickIterator).mAxisSetup;
  if ((pAVar1 == (AxisSetup *)0x0) || (fVar5 = this->mCurrentTick, pAVar1->mMax * 1.0001 < fVar5)) {
    bVar2 = false;
  }
  else {
    *outTick = fVar5;
    *outIsMajorTick = this->mCount % (long)(pAVar1->mTickInfo).mTickDivision == 0;
    TickInfo::MakeFormatString(fVar5,outFormatString);
    fVar5 = ((this->super_TickIterator).mAxisSetup)->mLogBase;
    fVar3 = SafeLog(this->mCurrentTick,fVar5,1.0);
    fVar4 = floorf(fVar3);
    fVar6 = (float)(int)fVar4;
    *outIsMajorTick = ABS(fVar3 - fVar6) < 0.0001;
    if (1 < ((this->super_TickIterator).mAxisSetup)->mLogFactor) {
      snprintf(local_98,0x80,"%d",(ulong)(uint)((int)fVar4 * 0x14));
      std::__cxx11::string::assign((char *)outFormatString);
    }
    fVar3 = this->mDelta;
    fVar4 = 1e+10;
    if (fVar6 <= 1e+10) {
      fVar4 = fVar6;
    }
    fVar5 = powf(fVar5,fVar4);
    this->mCurrentTick = fVar5 * fVar3 + this->mCurrentTick;
    this->mCount = this->mCount + 1;
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool LogTickIterator::GetNextTick (float &outTick, bool &outIsMajorTick, string &outFormatString) {
      if (!mAxisSetup) {
        return false;
      }
      if (mCurrentTick>mAxisSetup->mMax*kLittleIncrease) {
        return false;
      }
      outTick = mCurrentTick;
      outIsMajorTick = (mCount%mAxisSetup->mTickInfo.mTickDivision == 0);
      TickInfo::MakeFormatString (outTick, outFormatString);
      float theBase = mAxisSetup->mLogBase;
      float theLogFac = 1;//mAxisSetup->mLogFactor;
      float theLogNow = SafeLog(mCurrentTick, theBase, theLogFac);
      int thePowNow = (int)floor(theLogNow);
      outIsMajorTick = false;
      if (fabs (theLogNow-thePowNow)<kEps) {
        outIsMajorTick = true;
      }

      if (mAxisSetup->mLogFactor>1) {
        char theBuf[128];
        snprintf (theBuf, 128, "%d", thePowNow*20);
        outFormatString = theBuf;
      }

      mCurrentTick += mDelta*SafeExp (thePowNow, theBase, theLogFac);
      mCount++;

      return true;
    }